

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::do_actual_learning_wap(ldf *data,single_learner *base,size_t start_K,multi_ex *ec_seq)

{
  example *ec;
  wclass *pwVar1;
  example *ec_00;
  wclass *pwVar2;
  uint64_t uVar3;
  ulong uVar4;
  size_t k;
  size_t sVar5;
  ulong uVar6;
  float fVar7;
  vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> all_costs;
  ulong local_b0;
  label_t local_a8;
  label_t lStack_a0;
  label_t local_98;
  label_t *local_90;
  ulong local_88;
  single_learner *local_80;
  _Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> local_78;
  _Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> local_60;
  undefined1 local_48 [16];
  
  uVar4 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80 = base;
  for (sVar5 = start_K; sVar5 < uVar4; sVar5 = sVar5 + 1) {
    local_a8 = ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar5]->l).multi;
    std::vector<COST_SENSITIVE::wclass*,std::allocator<COST_SENSITIVE::wclass*>>::
    emplace_back<COST_SENSITIVE::wclass*>
              ((vector<COST_SENSITIVE::wclass*,std::allocator<COST_SENSITIVE::wclass*>> *)&local_78,
               (wclass **)&local_a8);
  }
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::vector
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
             &local_60,
             (vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
             &local_78);
  compute_wap_values((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
                     &local_60);
  std::_Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
  ~_Vector_base(&local_60);
  local_b0 = start_K + 1;
  for (; start_K < uVar4; start_K = start_K + 1) {
    ec = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
         super__Vector_impl_data._M_start[start_K];
    pwVar1 = (ec->l).cs.costs._begin;
    local_98 = (label_t)(ec->l).cs.costs.erase_count;
    local_a8 = (label_t)(ec->l).cs.costs._end;
    lStack_a0 = (label_t)(ec->l).cs.costs.end_array;
    if ((ulong)pwVar1->class_index != 0xffffffff) {
      local_88 = start_K;
      LabelDict::add_example_namespace_from_memory
                (&data->label_features,ec,(ulong)pwVar1->class_index);
      local_90 = (label_t *)&(ec->l).cs.costs._end;
      for (uVar6 = local_b0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
        ec_00 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        pwVar2 = (ec_00->l).cs.costs._begin;
        if (((ulong)pwVar2->class_index != 0xffffffff) &&
           (fVar7 = ABS(pwVar2->wap_value - pwVar1->wap_value), local_48 = ZEXT416((uint)fVar7),
           1e-06 <= fVar7)) {
          LabelDict::add_example_namespace_from_memory
                    (&data->label_features,ec_00,(ulong)pwVar2->class_index);
          (ec->l).simple.initial = 0.0;
          (ec->l).simple.label =
               *(float *)(&DAT_00238820 +
                         (ulong)(pwVar1->x <= pwVar2->x && pwVar2->x != pwVar1->x) * 4);
          fVar7 = ec->weight;
          ec->weight = (float)local_48._0_4_;
          ec->partial_prediction = 0.0;
          subtract_example(data->all,ec,ec_00);
          uVar3 = (ec->super_example_predict).ft_offset;
          (ec->super_example_predict).ft_offset = data->ft_offset;
          LEARNER::learner<char,_example>::learn(local_80,ec,0);
          (ec->super_example_predict).ft_offset = uVar3;
          ec->weight = fVar7;
          unsubtract_example(ec);
          LabelDict::del_example_namespace_from_memory
                    (&data->label_features,ec_00,(ulong)pwVar2->class_index);
        }
      }
      LabelDict::del_example_namespace_from_memory
                (&data->label_features,ec,(ulong)pwVar1->class_index);
      (ec->l).cs.costs._begin = pwVar1;
      local_90[2] = local_98;
      *local_90 = local_a8;
      local_90[1] = lStack_a0;
      start_K = local_88;
    }
    local_b0 = local_b0 + 1;
  }
  std::_Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
  ~_Vector_base(&local_78);
  return;
}

Assistant:

void do_actual_learning_wap(ldf& data, single_learner& base, size_t start_K, multi_ex& ec_seq)
{
  size_t K = ec_seq.size();
  vector<COST_SENSITIVE::wclass*> all_costs;
  for (size_t k = start_K; k < K; k++) all_costs.push_back(&ec_seq[k]->l.cs.costs[0]);
  compute_wap_values(all_costs);

  for (size_t k1 = start_K; k1 < K; k1++)
  {
    example* ec1 = ec_seq[k1];

    // save original variables
    COST_SENSITIVE::label save_cs_label = ec1->l.cs;
    label_data& simple_label = ec1->l.simple;

    v_array<COST_SENSITIVE::wclass> costs1 = save_cs_label.costs;
    if (costs1[0].class_index == (uint32_t)-1)
      continue;

    LabelDict::add_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    for (size_t k2 = k1 + 1; k2 < K; k2++)
    {
      example* ec2 = ec_seq[k2];
      v_array<COST_SENSITIVE::wclass> costs2 = ec2->l.cs.costs;

      if (costs2[0].class_index == (uint32_t)-1)
        continue;
      float value_diff = fabs(costs2[0].wap_value - costs1[0].wap_value);
      // float value_diff = fabs(costs2[0].x - costs1[0].x);
      if (value_diff < 1e-6)
        continue;

      LabelDict::add_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);

      // learn
      simple_label.initial = 0.;
      simple_label.label = (costs1[0].x < costs2[0].x) ? -1.0f : 1.0f;
      float old_weight = ec1->weight;
      ec1->weight = value_diff;
      ec1->partial_prediction = 0.;
      subtract_example(*data.all, ec1, ec2);
      uint64_t old_offset = ec1->ft_offset;
      ec1->ft_offset = data.ft_offset;
      base.learn(*ec1);
      ec1->ft_offset = old_offset;
      ec1->weight = old_weight;
      unsubtract_example(ec1);

      LabelDict::del_example_namespace_from_memory(data.label_features, *ec2, costs2[0].class_index);
    }
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec1, costs1[0].class_index);

    // restore original cost-sensitive label, sum of importance weights
    ec1->l.cs = save_cs_label;
    // TODO: What about partial_prediction? See do_actual_learning_oaa.
  }
}